

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bpp_tree_handler.c
# Opt level: O1

ion_cursor_status_t bpptree_next(ion_dict_cursor_t *cursor,ion_record_t *record)

{
  ion_dictionary_parent_t *piVar1;
  byte bVar2;
  ion_bpp_err_t iVar3;
  char cVar4;
  
  bVar2 = cursor->status;
  if (3 < bVar2 - 1) {
    return '\0';
  }
  piVar1 = cursor->dictionary->instance;
  switch((uint)bVar2) {
  default:
    goto switchD_001034d1_caseD_1;
  case 2:
    cursor->status = '\x04';
    break;
  case 4:
    cVar4 = cursor->predicate->type;
    if (cVar4 == '\x02') {
      if (cursor[1].dictionary == (ion_dictionary_t *)0xffffffffffffffff) {
        iVar3 = b_find_next_key(*(ion_bpp_handle_t *)(piVar1 + 1),*(void **)(cursor + 1),
                                (ion_bpp_external_address_t *)&cursor[1].dictionary);
        cVar4 = iVar3 == bErrOk;
        goto LAB_00103587;
      }
    }
    else if (cVar4 == '\x01') {
      if (cursor[1].dictionary == (ion_dictionary_t *)0xffffffffffffffff) {
        iVar3 = b_find_next_key(*(ion_bpp_handle_t *)(piVar1 + 1),*(void **)(cursor + 1),
                                (ion_bpp_external_address_t *)&cursor[1].dictionary);
        if (iVar3 != bErrOk) goto LAB_0010358f;
        cVar4 = test_predicate(cursor,*(ion_key_t *)(cursor + 1));
        goto LAB_00103587;
      }
    }
    else if (cVar4 == '\0') {
      cVar4 = cursor[1].dictionary != (ion_dictionary_t *)0xffffffffffffffff;
LAB_00103587:
      if (cVar4 == '\0') {
LAB_0010358f:
        cursor->status = '\x01';
        return '\x01';
      }
    }
  }
  memcpy(record->key,*(void **)(cursor + 1),(long)(cursor->dictionary->instance->record).key_size);
  lfb_get((ion_lfb_t *)&piVar1[1].record.value_size,(ion_file_offset_t)cursor[1].dictionary,
          (cursor->dictionary->instance->record).value_size,(ion_byte_t *)record->value,
          (ion_file_offset_t *)&cursor[1].dictionary);
  bVar2 = cursor->status;
switchD_001034d1_caseD_1:
  return bVar2;
}

Assistant:

ion_cursor_status_t
bpptree_next(
	ion_dict_cursor_t	*cursor,
	ion_record_t		*record
) {
	ion_bpp_cursor_t	*bCursor	= (ion_bpp_cursor_t *) cursor;
	ion_bpptree_t		*bpptree	= (ion_bpptree_t *) cursor->dictionary->instance;

	if (cursor->status == cs_cursor_uninitialized) {
		return cursor->status;
	}
	else if (cursor->status == cs_end_of_results) {
		return cursor->status;
	}
	else if ((cursor->status == cs_cursor_initialized) || (cursor->status == cs_cursor_active)) {
		if (cursor->status == cs_cursor_active) {
			ion_boolean_t is_valid = boolean_true;

			switch (cursor->predicate->type) {
				case predicate_equality: {
					if (-1 == bCursor->offset) {
						/* End of results, we can quit */
						is_valid = boolean_false;
					}

					break;
				}

				case predicate_range: {
					/*do b_find_next_key then test_predicate */
					if (-1 == bCursor->offset) {
						ion_bpp_err_t bErr = b_find_next_key(bpptree->tree, bCursor->cur_key, &bCursor->offset);

						if ((bErrOk != bErr) || (boolean_false == test_predicate(cursor, bCursor->cur_key))) {
							is_valid = boolean_false;
						}
					}

					break;
				}

				case predicate_all_records: {
					if (-1 == bCursor->offset) {
						ion_bpp_err_t bErr = b_find_next_key(bpptree->tree, bCursor->cur_key, &bCursor->offset);

						if (bErrOk != bErr) {
							is_valid = boolean_false;
						}
					}

					break;
				}

				case predicate_predicate: {
					break;
				}
					/*No default since we can assume the predicate is valid. */
			}

			if (boolean_false == is_valid) {
				cursor->status = cs_end_of_results;
				return cursor->status;
			}
		}
		else {
			/* The status is cs_cursor_initialized */
			cursor->status = cs_cursor_active;
		}

		/* Get key */
		memcpy(record->key, bCursor->cur_key, cursor->dictionary->instance->record.key_size);

		/* Get value */
		lfb_get(&(bpptree->values), bCursor->offset, cursor->dictionary->instance->record.value_size, record->value, &bCursor->offset);
		return cursor->status;
	}

	return cs_invalid_cursor;
}